

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

bool __thiscall
llvm::
DenseMapBase<llvm::DenseMap<unsigned_long,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseSetPair<unsigned_long>_>,_unsigned_long,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseSetPair<unsigned_long>_>
::LookupBucketFor<unsigned_long>
          (DenseMapBase<llvm::DenseMap<unsigned_long,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseSetPair<unsigned_long>_>,_unsigned_long,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseSetPair<unsigned_long>_>
           *this,unsigned_long *Val,DenseSetPair<unsigned_long> **FoundBucket)

{
  DenseSetPair<unsigned_long> **LHS;
  bool bVar1;
  bool bVar2;
  uint uVar3;
  unsigned_long *puVar4;
  DenseSetPair<unsigned_long> *local_80;
  DenseSetPair<unsigned_long> *ThisBucket;
  uint ProbeAmt;
  uint BucketNo;
  unsigned_long TombstoneKey;
  unsigned_long EmptyKey;
  DenseSetPair<unsigned_long> *FoundTombstone;
  DenseSetPair<unsigned_long> *pDStack_30;
  uint NumBuckets;
  DenseSetPair<unsigned_long> *BucketsPtr;
  DenseSetPair<unsigned_long> **FoundBucket_local;
  unsigned_long *Val_local;
  DenseMapBase<llvm::DenseMap<unsigned_long,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseSetPair<unsigned_long>_>,_unsigned_long,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseSetPair<unsigned_long>_>
  *this_local;
  
  BucketsPtr = (DenseSetPair<unsigned_long> *)FoundBucket;
  FoundBucket_local = (DenseSetPair<unsigned_long> **)Val;
  Val_local = (unsigned_long *)this;
  pDStack_30 = getBuckets(this);
  FoundTombstone._4_4_ = getNumBuckets(this);
  if (FoundTombstone._4_4_ == 0) {
    BucketsPtr->key = 0;
    this_local._7_1_ = false;
  }
  else {
    EmptyKey = 0;
    TombstoneKey = getEmptyKey();
    _ProbeAmt = getTombstoneKey();
    bVar1 = DenseMapInfo<unsigned_long>::isEqual((unsigned_long *)FoundBucket_local,&TombstoneKey);
    bVar2 = false;
    if (!bVar1) {
      bVar1 = DenseMapInfo<unsigned_long>::isEqual
                        ((unsigned_long *)FoundBucket_local,(unsigned_long *)&ProbeAmt);
      bVar2 = false;
      if (!bVar1) {
        bVar2 = true;
      }
    }
    if (!bVar2) {
      __assert_fail("!KeyInfoT::isEqual(Val, EmptyKey) && !KeyInfoT::isEqual(Val, TombstoneKey) && \"Empty/Tombstone value shouldn\'t be inserted into map!\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/include/llvm/ADT/DenseMap.h"
                    ,0x252,
                    "bool llvm::DenseMapBase<llvm::DenseMap<unsigned long, llvm::detail::DenseSetEmpty, llvm::DenseMapInfo<unsigned long>, llvm::detail::DenseSetPair<unsigned long>>, unsigned long, llvm::detail::DenseSetEmpty, llvm::DenseMapInfo<unsigned long>, llvm::detail::DenseSetPair<unsigned long>>::LookupBucketFor(const LookupKeyT &, const BucketT *&) const [DerivedT = llvm::DenseMap<unsigned long, llvm::detail::DenseSetEmpty, llvm::DenseMapInfo<unsigned long>, llvm::detail::DenseSetPair<unsigned long>>, KeyT = unsigned long, ValueT = llvm::detail::DenseSetEmpty, KeyInfoT = llvm::DenseMapInfo<unsigned long>, BucketT = llvm::detail::DenseSetPair<unsigned long>, LookupKeyT = unsigned long]"
                   );
    }
    uVar3 = getHashValue((unsigned_long *)FoundBucket_local);
    ThisBucket._4_4_ = uVar3 & FoundTombstone._4_4_ - 1;
    ThisBucket._0_4_ = 1;
    while( true ) {
      LHS = FoundBucket_local;
      local_80 = pDStack_30 + ThisBucket._4_4_;
      puVar4 = detail::DenseSetPair<unsigned_long>::getFirst(local_80);
      bVar2 = DenseMapInfo<unsigned_long>::isEqual((unsigned_long *)LHS,puVar4);
      if (bVar2) break;
      puVar4 = detail::DenseSetPair<unsigned_long>::getFirst(local_80);
      bVar2 = DenseMapInfo<unsigned_long>::isEqual(puVar4,&TombstoneKey);
      if (bVar2) {
        if (EmptyKey != 0) {
          local_80 = (DenseSetPair<unsigned_long> *)EmptyKey;
        }
        BucketsPtr->key = (unsigned_long)local_80;
        return false;
      }
      puVar4 = detail::DenseSetPair<unsigned_long>::getFirst(local_80);
      bVar2 = DenseMapInfo<unsigned_long>::isEqual(puVar4,(unsigned_long *)&ProbeAmt);
      if ((bVar2) && (EmptyKey == 0)) {
        EmptyKey = (unsigned_long)local_80;
      }
      ThisBucket._4_4_ = FoundTombstone._4_4_ - 1 & (int)ThisBucket + ThisBucket._4_4_;
      ThisBucket._0_4_ = (int)ThisBucket + 1;
    }
    BucketsPtr->key = (unsigned_long)local_80;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool LookupBucketFor(const LookupKeyT &Val,
                       const BucketT *&FoundBucket) const {
    const BucketT *BucketsPtr = getBuckets();
    const unsigned NumBuckets = getNumBuckets();

    if (NumBuckets == 0) {
      FoundBucket = nullptr;
      return false;
    }

    // FoundTombstone - Keep track of whether we find a tombstone while probing.
    const BucketT *FoundTombstone = nullptr;
    const KeyT EmptyKey = getEmptyKey();
    const KeyT TombstoneKey = getTombstoneKey();
    assert(!KeyInfoT::isEqual(Val, EmptyKey) &&
           !KeyInfoT::isEqual(Val, TombstoneKey) &&
           "Empty/Tombstone value shouldn't be inserted into map!");

    unsigned BucketNo = getHashValue(Val) & (NumBuckets-1);
    unsigned ProbeAmt = 1;
    while (true) {
      const BucketT *ThisBucket = BucketsPtr + BucketNo;
      // Found Val's bucket?  If so, return it.
      if (LLVM_LIKELY(KeyInfoT::isEqual(Val, ThisBucket->getFirst()))) {
        FoundBucket = ThisBucket;
        return true;
      }

      // If we found an empty bucket, the key doesn't exist in the set.
      // Insert it and return the default value.
      if (LLVM_LIKELY(KeyInfoT::isEqual(ThisBucket->getFirst(), EmptyKey))) {
        // If we've already seen a tombstone while probing, fill it in instead
        // of the empty bucket we eventually probed to.
        FoundBucket = FoundTombstone ? FoundTombstone : ThisBucket;
        return false;
      }

      // If this is a tombstone, remember it.  If Val ends up not in the map, we
      // prefer to return it than something that would require more probing.
      if (KeyInfoT::isEqual(ThisBucket->getFirst(), TombstoneKey) &&
          !FoundTombstone)
        FoundTombstone = ThisBucket;  // Remember the first tombstone found.

      // Otherwise, it's a hash collision or a tombstone, continue quadratic
      // probing.
      BucketNo += ProbeAmt++;
      BucketNo &= (NumBuckets-1);
    }
  }